

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_mct(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  uint uVar1;
  void *pvVar2;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  opj_mct_data_t *l_mct_data;
  OPJ_UINT32 l_indix;
  OPJ_UINT32 l_tmp;
  opj_tcp_v2_t *l_tcp;
  OPJ_UINT32 i;
  long local_50;
  uint *local_48;
  uint local_3c;
  long local_38;
  uint local_2c;
  opj_event_mgr_t *local_28;
  uint local_1c;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_50 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
  }
  else {
    local_50 = *(long *)(in_RDI + 0x10);
  }
  local_38 = local_50;
  if (in_EDX < 2) {
    opj_event_msg_v2(in_RCX,1,"Error reading MCT marker\n");
    local_4 = 0;
  }
  else {
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    opj_read_bytes_LE(in_RSI,&local_3c,2);
    local_18 = local_18 + 2;
    if (local_3c == 0) {
      if (local_1c < 7) {
        opj_event_msg_v2(local_28,1,"Error reading MCT marker\n");
        local_4 = 0;
      }
      else {
        opj_read_bytes_LE(local_18,&local_3c,2);
        local_18 = local_18 + 2;
        uVar1 = local_3c & 0xff;
        local_48 = *(uint **)(local_38 + 0x1608);
        local_2c = 0;
        for (; (local_2c < *(uint *)(local_38 + 0x1610) && (local_48[2] != uVar1));
            local_48 = local_48 + 8) {
          local_2c = local_2c + 1;
        }
        if (local_2c == *(uint *)(local_38 + 0x1610)) {
          if (*(int *)(local_38 + 0x1610) == *(int *)(local_38 + 0x1614)) {
            *(int *)(local_38 + 0x1614) = *(int *)(local_38 + 0x1614) + 10;
            pvVar2 = realloc(*(void **)(local_38 + 0x1608),(ulong)*(uint *)(local_38 + 0x1614) << 5)
            ;
            *(void **)(local_38 + 0x1608) = pvVar2;
            if (*(long *)(local_38 + 0x1608) == 0) {
              opj_event_msg_v2(local_28,1,"Error reading MCT marker\n");
              return 0;
            }
            memset((void *)(*(long *)(local_38 + 0x1608) +
                           (ulong)*(uint *)(local_38 + 0x1610) * 0x20),0,
                   (ulong)(uint)(*(int *)(local_38 + 0x1614) - *(int *)(local_38 + 0x1610)) << 5);
          }
          local_48 = (uint *)(*(long *)(local_38 + 0x1608) +
                             (ulong)*(uint *)(local_38 + 0x1610) * 0x20);
        }
        if (*(long *)(local_48 + 4) != 0) {
          free(*(void **)(local_48 + 4));
          local_48[4] = 0;
          local_48[5] = 0;
        }
        local_48[2] = uVar1;
        local_48[1] = local_3c >> 8 & 3;
        *local_48 = local_3c >> 10 & 3;
        opj_read_bytes_LE(local_18,&local_3c,2);
        local_18 = local_18 + 2;
        if (local_3c == 0) {
          local_1c = local_1c - 6;
          pvVar2 = malloc((ulong)local_1c);
          *(void **)(local_48 + 4) = pvVar2;
          if (*(long *)(local_48 + 4) == 0) {
            opj_event_msg_v2(local_28,1,"Error reading MCT marker\n");
            local_4 = 0;
          }
          else {
            memcpy(*(void **)(local_48 + 4),local_18,(ulong)local_1c);
            local_48[6] = local_1c;
            *(int *)(local_38 + 0x1610) = *(int *)(local_38 + 0x1610) + 1;
            local_4 = 1;
          }
        }
        else {
          opj_event_msg_v2(local_28,2,"Cannot take in charge multiple MCT markers\n");
          local_4 = 1;
        }
      }
    }
    else {
      opj_event_msg_v2(local_28,2,"Cannot take in charge mct data within multiple MCT records\n");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_mct (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 i;
	opj_tcp_v2_t *l_tcp = 00;
	OPJ_UINT32 l_tmp;
	OPJ_UINT32 l_indix;
	opj_mct_data_t * l_mct_data;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);

	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 2) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* first marker */
	opj_read_bytes(p_header_data,&l_tmp,2);				/* Zmct */
	p_header_data += 2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge mct data within multiple MCT records\n");
		return OPJ_TRUE;
	}

	if(p_header_size <= 6) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
	opj_read_bytes(p_header_data,&l_tmp,2); 			/* Imct */
	p_header_data += 2;

	l_indix = l_tmp & 0xff;
	l_mct_data = l_tcp->m_mct_records;

	for (i=0;i<l_tcp->m_nb_mct_records;++i) {
		if (l_mct_data->m_index == l_indix) {
			break;
		}
		++l_mct_data;
	}

	/* NOT FOUND */
	if (i == l_tcp->m_nb_mct_records) {
		if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
			l_tcp->m_nb_max_mct_records += J2K_MCT_DEFAULT_NB_RECORDS;

			l_tcp->m_mct_records = (opj_mct_data_t*)opj_realloc(l_tcp->m_mct_records,l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
			if(! l_tcp->m_mct_records) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
				return OPJ_FALSE;
			}

			l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
			memset(l_mct_data ,0,(l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) * sizeof(opj_mct_data_t));
		}

		l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
	}

	if (l_mct_data->m_data) {
		opj_free(l_mct_data->m_data);
		l_mct_data->m_data = 00;
	}

	l_mct_data->m_index = l_indix;
	l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
	l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

	opj_read_bytes(p_header_data,&l_tmp,2);				/* Ymct */
	p_header_data+=2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple MCT markers\n");
		return OPJ_TRUE;
	}

	p_header_size -= 6;

	l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
	if (! l_mct_data->m_data) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}
	memcpy(l_mct_data->m_data,p_header_data,p_header_size);

	l_mct_data->m_data_size = p_header_size;
	++l_tcp->m_nb_mct_records;

	return OPJ_TRUE;
}